

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::VisitComponent(cmComputeLinkDepends *this,uint c)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  __tmp;
  pointer pcVar5;
  
  pcVar1 = (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1[c] == '\0') {
    pcVar1[c] = '\x01';
    pcVar2 = (this->CCG->ComponentGraph).
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = *(pointer *)
              &pcVar2[(int)c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
               super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    for (pcVar5 = *(pointer *)
                   ((long)&pcVar2[(int)c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                           super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        pcVar5 != pcVar3; pcVar5 = pcVar5 + -1) {
      VisitComponent(this,pcVar5[-1].Dest);
    }
    iVar4 = this->ComponentOrderId + -1;
    this->ComponentOrderId = iVar4;
    (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[c] = iVar4;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitComponent(unsigned int c)
{
  // Check if the node has already been visited.
  if (this->ComponentVisited[c]) {
    return;
  }

  // We are now visiting this component so mark it.
  this->ComponentVisited[c] = 1;

  // Visit the neighbors of the component first.
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  EdgeList const& nl = this->CCG->GetComponentGraphEdges(c);
  for (cmGraphEdge const& edge : cmReverseRange(nl)) {
    this->VisitComponent(edge);
  }

  // Assign an ordering id to this component.
  this->ComponentOrder[c] = --this->ComponentOrderId;
}